

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O2

TestCaseGroup * vkt::pipeline::createMultisampleInterpolationTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  ostream *poVar2;
  MultisampleCaseBase *node;
  TestNode *pTVar3;
  long lVar4;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  int local_36c;
  undefined1 local_368 [16];
  undefined8 local_358;
  VkSampleCountFlagBits imageSamples [6];
  UVec3 imageSize;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> sizeGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> caseGroup;
  ImageMSParams local_2f8;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  ostringstream imageSizeStream;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,testCtx,"multisample_interpolation","Multisample Interpolation");
  local_368._0_4_ = 0x80;
  local_368._4_4_ = 0x80;
  local_368._8_8_ = 0x8900000001;
  local_358 = 0x1000000bf;
  imageSamples[0] = VK_SAMPLE_COUNT_2_BIT;
  imageSamples[1] = VK_SAMPLE_COUNT_4_BIT;
  imageSamples[2] = VK_SAMPLE_COUNT_8_BIT;
  imageSamples[3] = VK_SAMPLE_COUNT_16_BIT;
  imageSamples[4] = VK_SAMPLE_COUNT_32_BIT;
  imageSamples[5] = VK_SAMPLE_COUNT_64_BIT;
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar1;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"sample_interpolate_at_single_sample_","");
  caseGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar1;
  for (lVar4 = 0;
      pTVar1 = caseGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar4 != 0x18; lVar4 = lVar4 + 0xc) {
    tcu::Vector<unsigned_int,_3>::Vector(&imageSize,(Vector<unsigned_int,_3> *)(local_368 + lVar4));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&imageSizeStream);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&imageSizeStream);
    poVar2 = std::operator<<(poVar2,"_");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"_");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    pTVar1 = (TestCaseGroup *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,local_1e8._M_dataplus._M_p,"");
    sizeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = pTVar1;
    std::__cxx11::string::~string((string *)&local_1e8);
    pTVar1 = sizeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    local_36c = 1;
    de::toString<int>(&local_1c8,&local_36c);
    std::operator+(&local_1e8,"samples_",&local_1c8);
    local_2f8.numSamples = VK_SAMPLE_COUNT_1_BIT;
    tcu::Vector<unsigned_int,_3>::Vector(&local_2f8.imageSize,&imageSize);
    node = multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleSingleSample>::
           createCase(testCtx,&local_1e8,&local_2f8);
    tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)node);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    pTVar1 = sizeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    sizeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(caseGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar1->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&sizeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&imageSizeStream);
  }
  caseGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(testGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  pTVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"sample_interpolate_at_distinct_values",
             (allocator<char> *)&imageSizeStream);
  pTVar3 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleDistinctValues>>
                      (testCtx,&local_208,(UVec3 *)local_368,2,imageSamples,6)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_208);
  pTVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"sample_interpolate_at_ignores_centroid",
             (allocator<char> *)&imageSizeStream);
  pTVar3 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleIgnoresCentroid>>
                      (testCtx,&local_228,(UVec3 *)local_368,2,imageSamples,6)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_228);
  pTVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"sample_interpolate_at_consistency",
             (allocator<char> *)&imageSizeStream);
  pTVar3 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleConsistency>>
                      (testCtx,&local_248,(UVec3 *)local_368,2,imageSamples,6)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_248);
  pTVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"sample_qualifier_distinct_values",
             (allocator<char> *)&imageSizeStream);
  pTVar3 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSampleQualifierDistinctValues>>
                      (testCtx,&local_268,(UVec3 *)local_368,2,imageSamples,6)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_268);
  pTVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"centroid_interpolate_at_consistency",
             (allocator<char> *)&imageSizeStream);
  pTVar3 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtCentroidConsistency>>
                      (testCtx,&local_288,(UVec3 *)local_368,2,imageSamples,6)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_288);
  pTVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"centroid_qualifier_inside_primitive",
             (allocator<char> *)&imageSizeStream);
  pTVar3 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseCentroidQualifierInsidePrimitive>>
                      (testCtx,&local_2a8,(UVec3 *)local_368,2,imageSamples,6)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_2a8);
  pTVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"offset_interpolate_at_pixel_center",
             (allocator<char> *)&imageSizeStream);
  pTVar3 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtOffsetPixelCenter>>
                      (testCtx,&local_2c8,(UVec3 *)local_368,2,imageSamples,6)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_2c8);
  pTVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"offset_interpolate_at_sample_position",
             (allocator<char> *)&imageSizeStream);
  pTVar3 = &makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtOffsetSamplePosition>>
                      (testCtx,&local_2e8,(UVec3 *)local_368,2,imageSamples,6)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_2e8);
  pTVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&caseGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&testGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createMultisampleInterpolationTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "multisample_interpolation", "Multisample Interpolation"));

	const tcu::UVec3 imageSizes[] =
	{
		tcu::UVec3(128u, 128u, 1u),
		tcu::UVec3(137u, 191u, 1u),
	};

	const deUint32 sizesElemCount = static_cast<deUint32>(sizeof(imageSizes) / sizeof(tcu::UVec3));

	const vk::VkSampleCountFlagBits imageSamples[] =
	{
		vk::VK_SAMPLE_COUNT_2_BIT,
		vk::VK_SAMPLE_COUNT_4_BIT,
		vk::VK_SAMPLE_COUNT_8_BIT,
		vk::VK_SAMPLE_COUNT_16_BIT,
		vk::VK_SAMPLE_COUNT_32_BIT,
		vk::VK_SAMPLE_COUNT_64_BIT,
	};

	const deUint32 samplesElemCount = static_cast<deUint32>(sizeof(imageSamples) / sizeof(vk::VkSampleCountFlagBits));

	de::MovePtr<tcu::TestCaseGroup> caseGroup(new tcu::TestCaseGroup(testCtx, "sample_interpolate_at_single_sample_", ""));

	for (deUint32 imageSizeNdx = 0u; imageSizeNdx < sizesElemCount; ++imageSizeNdx)
	{
		const tcu::UVec3	imageSize = imageSizes[imageSizeNdx];
		std::ostringstream	imageSizeStream;

		imageSizeStream << imageSize.x() << "_" << imageSize.y() << "_" << imageSize.z();

		de::MovePtr<tcu::TestCaseGroup> sizeGroup(new tcu::TestCaseGroup(testCtx, imageSizeStream.str().c_str(), ""));

		sizeGroup->addChild(multisample::MSCase<multisample::MSCaseInterpolateAtSampleSingleSample>::createCase(testCtx, "samples_" + de::toString(1), multisample::ImageMSParams(vk::VK_SAMPLE_COUNT_1_BIT, imageSize)));

		caseGroup->addChild(sizeGroup.release());
	}

	testGroup->addChild(caseGroup.release());

	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseInterpolateAtSampleDistinctValues> >	(testCtx, "sample_interpolate_at_distinct_values",	imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseInterpolateAtSampleIgnoresCentroid> >(testCtx, "sample_interpolate_at_ignores_centroid",	imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseInterpolateAtSampleConsistency> >	(testCtx, "sample_interpolate_at_consistency",		imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseSampleQualifierDistinctValues> >		(testCtx, "sample_qualifier_distinct_values",		imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseInterpolateAtCentroidConsistency> >	(testCtx, "centroid_interpolate_at_consistency",	imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseCentroidQualifierInsidePrimitive> >	(testCtx, "centroid_qualifier_inside_primitive",	imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseInterpolateAtOffsetPixelCenter> >	(testCtx, "offset_interpolate_at_pixel_center",		imageSizes, sizesElemCount, imageSamples, samplesElemCount));
	testGroup->addChild(makeMSGroup<multisample::MSCase<multisample::MSCaseInterpolateAtOffsetSamplePosition> >	(testCtx, "offset_interpolate_at_sample_position",	imageSizes, sizesElemCount, imageSamples, samplesElemCount));

	return testGroup.release();
}